

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial-3.cpp
# Opt level: O0

void readHandler(error_code *error,size_t bytes_transferred,socket_ptr *socket,array_ptr *readBuffer
                )

{
  size_t sVar1;
  bool bVar2;
  ostream *this;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  type this_01;
  char *pcVar3;
  shared_ptr<boost::array<char,_1024UL>_> *a4;
  type data;
  error_code ec;
  bool local_bd;
  shared_ptr<boost::array<char,_1024UL>_> local_b0;
  shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  local_a0;
  bind_t<void,_void_(*)(const_boost::system::error_code_&,_unsigned_long,_boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_boost::shared_ptr<boost::array<char,_1024UL>_>),_boost::_bi::list4<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::array<char,_1024UL>_>_>_>_>
  local_90;
  mutable_buffer local_68;
  error_code local_58;
  error_category *local_48;
  undefined8 local_40;
  error_code local_38;
  array_ptr *local_28;
  array_ptr *readBuffer_local;
  socket_ptr *socket_local;
  size_t bytes_transferred_local;
  error_code *error_local;
  
  local_28 = readBuffer;
  readBuffer_local = (array_ptr *)socket;
  socket_local = (socket_ptr *)bytes_transferred;
  bytes_transferred_local = (size_t)error;
  bVar2 = boost::system::error_code::operator_cast_to_bool(error);
  sVar1 = bytes_transferred_local;
  local_bd = false;
  if (bVar2) {
    boost::system::error_code::error_code<boost::asio::error::misc_errors>
              (&local_38,eof,(type *)0x0);
    local_bd = boost::system::operator!=((error_code *)sVar1,&local_38);
  }
  if (local_bd != false) {
    this = std::operator<<((ostream *)&std::cerr,"Read error: ");
    local_48 = *(error_category **)bytes_transferred_local;
    local_40 = *(undefined8 *)(bytes_transferred_local + 8);
    ec.cat_ = local_48;
    ec.val_ = (int)local_40;
    ec.failed_ = (bool)(char)((ulong)local_40 >> 0x20);
    ec._5_3_ = (int3)((ulong)local_40 >> 0x28);
    this_00 = boost::system::operator<<
                        ((system *)this,(basic_ostream<char,_std::char_traits<char>_> *)local_48,ec)
    ;
    std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
    exit(5);
  }
  this_01 = boost::shared_ptr<boost::array<char,_1024UL>_>::operator->(readBuffer);
  pcVar3 = boost::array<char,_1024UL>::data(this_01);
  std::ostream::write((char *)&std::cout,(long)pcVar3);
  sVar1 = bytes_transferred_local;
  boost::system::error_code::error_code<boost::asio::error::misc_errors>(&local_58,eof,(type *)0x0);
  bVar2 = boost::system::operator!=((error_code *)sVar1,&local_58);
  if (bVar2) {
    a4 = (shared_ptr<boost::array<char,_1024UL>_> *)
         boost::
         shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
         ::operator*(socket);
    data = boost::shared_ptr<boost::array<char,_1024UL>_>::operator*(readBuffer);
    local_68 = (mutable_buffer)boost::asio::buffer<char,1024ul>(data);
    boost::
    shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::shared_ptr(&local_a0,socket);
    boost::shared_ptr<boost::array<char,_1024UL>_>::shared_ptr(&local_b0,readBuffer);
    boost::
    bind<void,boost::system::error_code_const&,unsigned_long,boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::shared_ptr<boost::array<char,1024ul>>,boost::arg<1>(*)(),boost::arg<2>(*)(),boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::shared_ptr<boost::array<char,1024ul>>>
              (&local_90,(boost *)readHandler,boost::asio::placeholders::error,
               boost::asio::placeholders::bytes_transferred,(_func_arg<2> *)&local_a0,
               (shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                *)&local_b0,a4);
    boost::asio::
    async_read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,boost::_bi::bind_t<void,void(*)(boost::system::error_code_const&,unsigned_long,boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_conte___ationship::continuation_t<0>>>>>>,boost::_bi::value<boost::shared_ptr<boost::array<char,1024ul>>>>>>
              ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)a4,(mutable_buffers_1 *)&local_68,&local_90,(type *)0x0);
    boost::_bi::
    bind_t<void,_void_(*)(const_boost::system::error_code_&,_unsigned_long,_boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_boost::shared_ptr<boost::array<char,_1024UL>_>),_boost::_bi::list4<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::array<char,_1024UL>_>_>_>_>
    ::~bind_t(&local_90);
    boost::shared_ptr<boost::array<char,_1024UL>_>::~shared_ptr(&local_b0);
    boost::
    shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::~shared_ptr(&local_a0);
  }
  return;
}

Assistant:

void readHandler(
    const boost::system::error_code&    error,
    size_t                              bytes_transferred,
    socket_ptr                          socket,
    array_ptr                           readBuffer
){
    if( error && error != boost::asio::error::eof ){
        cerr << "Read error: " << error << endl;
        exit( READ_FAILURE );
    }

    // We have received some data, so now we'll write it out.
    cout.write( readBuffer->data(), bytes_transferred );

    // If we haven't reached the end of file yet, trigger another asynchronous read just like the
    // one in the `writeHandler`.
    if( error != boost::asio::error::eof ){
        boost::asio::async_read(
            *socket,
            boost::asio::buffer( *readBuffer ),
            boost::bind(
                &readHandler,
                boost::asio::placeholders::error,
                boost::asio::placeholders::bytes_transferred,
                socket,
                readBuffer
            )
        );
    }
}